

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::App::help(App *this,string *prev,AppFormatMode mode)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  element_type *peVar4;
  uint in_ECX;
  App *in_RDX;
  App *in_RSI;
  string *in_RDI;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  App *in_stack_ffffffffffffff18;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_stack_ffffffffffffff20;
  string local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string local_88 [72];
  string local_40 [28];
  AppFormatMode in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  App *this_00;
  
  this_00 = in_RDX;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    get_name_abi_cxx11_(in_RSI);
    ::std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    ::std::__cxx11::string::operator+=((string *)in_RDX,local_40);
    ::std::__cxx11::string::~string(local_40);
  }
  else {
    psVar3 = get_name_abi_cxx11_(in_RSI);
    ::std::__cxx11::string::operator=((string *)in_RDX,(string *)psVar3);
  }
  get_subcommands(in_stack_ffffffffffffff18);
  bVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty
                    ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)in_RDX);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12807b);
    ::std::__cxx11::string::string(local_b0,(string *)in_RDX);
    (*peVar4->_vptr_FormatterBase[2])(in_RDI,peVar4,in_RSI,local_b0,(ulong)in_ECX);
    ::std::__cxx11::string::~string(local_b0);
  }
  else {
    std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::back(in_stack_ffffffffffffff20);
    ::std::__cxx11::string::string(local_88,(string *)in_RDX);
    help(this_00,(string *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    ::std::__cxx11::string::~string(local_88);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)in_RDX);
  return in_RDI;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string App::help(std::string prev, AppFormatMode mode) const {
    if(prev.empty())
        prev = get_name();
    else
        prev += " " + get_name();

    // Delegate to subcommand if needed
    auto selected_subcommands = get_subcommands();
    if(!selected_subcommands.empty()) {
        return selected_subcommands.back()->help(prev, mode);
    }
    return formatter_->make_help(this, prev, mode);
}